

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O2

void __thiscall
pzgeom::TPZArc3D::GradX<Fad<double>>
          (TPZArc3D *this,TPZFMatrix<double> *coord,TPZVec<Fad<double>_> *par,
          TPZFMatrix<Fad<double>_> *gradx)

{
  double *pdVar1;
  long lVar2;
  undefined1 local_990 [24];
  Fad<double> *pFStack_978;
  TPZArc3D *local_968;
  undefined1 local_960 [16];
  Fad<double> *local_950;
  double local_948;
  Fad<double> Vtnorm;
  Fad<double> scale;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_900;
  Fad<double> **local_8f0;
  Fad<double> *local_8e8;
  Fad<double> *local_8e0;
  Fad<double> *local_8d8;
  Fad<double> **local_8d0;
  Fad<double> *local_8c8;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> local_8c0;
  double local_8a0;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *local_898;
  Fad<double> *local_890;
  double local_888;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *local_880;
  undefined1 local_878 [8];
  TPZManVector<Fad<double>,_10> OUTv;
  TPZManVector<Fad<double>,_10> Vpb;
  TPZManVector<Fad<double>,_10> Vpa;
  TPZManVector<Fad<double>,_10> Vpc;
  TPZManVector<Fad<double>,_10> middle;
  TPZManVector<Fad<double>,_10> Vt;
  
  Vpa.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  Vpa.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  Vpa.super_TPZVec<Fad<double>_>.fNElements = 0;
  Vpa.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&Vpc,3,(Fad<double> *)&Vpa);
  Fad<double>::~Fad((Fad<double> *)&Vpa);
  Vpb.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  Vpb.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  Vpb.super_TPZVec<Fad<double>_>.fNElements = 0;
  Vpb.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&Vpa,3,(Fad<double> *)&Vpb);
  Fad<double>::~Fad((Fad<double> *)&Vpb);
  Vt.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  Vt.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  Vt.super_TPZVec<Fad<double>_>.fNElements = 0;
  Vt.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&Vpb,3,(Fad<double> *)&Vt);
  Fad<double>::~Fad((Fad<double> *)&Vt);
  OUTv.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  OUTv.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  OUTv.super_TPZVec<Fad<double>_>.fNElements = 0;
  OUTv.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&Vt,3,(Fad<double> *)&OUTv);
  Fad<double>::~Fad((Fad<double> *)&OUTv);
  middle.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  middle.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  middle.super_TPZVec<Fad<double>_>.fNElements = 0;
  middle.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&OUTv,3,(Fad<double> *)&middle);
  Fad<double>::~Fad((Fad<double> *)&middle);
  local_990._0_8_ = (Fad<double> *)0x0;
  local_990._8_8_ = (ulong)(uint)local_990._12_4_ << 0x20;
  local_990._16_8_ = (double *)0x0;
  pFStack_978 = (Fad<double> *)0x0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&middle,1,(Fad<double> *)local_990);
  Fad<double>::~Fad((Fad<double> *)local_990);
  X<Fad<double>>(this,coord,&middle.super_TPZVec<Fad<double>_>,&OUTv.super_TPZVec<Fad<double>_>);
  pdVar1 = TPZFMatrix<double>::operator()(coord,0,0);
  local_990._8_8_ = *pdVar1;
  local_990._16_8_ = (double *)0x0;
  pFStack_978 = (Fad<double> *)
                CONCAT44(OUTv.super_TPZVec<Fad<double>_>.fStore._4_4_,
                         OUTv.super_TPZVec<Fad<double>_>.fStore._0_4_);
  Fad<double>::operator=
            ((Fad<double> *)
             CONCAT44(Vpa.super_TPZVec<Fad<double>_>.fStore._4_4_,
                      Vpa.super_TPZVec<Fad<double>_>.fStore._0_4_),
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_990);
  pdVar1 = TPZFMatrix<double>::operator()(coord,1,0);
  local_990._8_8_ = *pdVar1;
  local_990._16_8_ = (double *)0x0;
  pFStack_978 = (Fad<double> *)
                (CONCAT44(OUTv.super_TPZVec<Fad<double>_>.fStore._4_4_,
                          OUTv.super_TPZVec<Fad<double>_>.fStore._0_4_) + 0x20);
  Fad<double>::operator=
            ((Fad<double> *)
             (CONCAT44(Vpa.super_TPZVec<Fad<double>_>.fStore._4_4_,
                       Vpa.super_TPZVec<Fad<double>_>.fStore._0_4_) + 0x20),
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_990);
  pdVar1 = TPZFMatrix<double>::operator()(coord,2,0);
  local_990._8_8_ = *pdVar1;
  local_990._16_8_ = (double *)0x0;
  pFStack_978 = (Fad<double> *)
                (CONCAT44(OUTv.super_TPZVec<Fad<double>_>.fStore._4_4_,
                          OUTv.super_TPZVec<Fad<double>_>.fStore._0_4_) + 0x40);
  Fad<double>::operator=
            ((Fad<double> *)
             (CONCAT44(Vpa.super_TPZVec<Fad<double>_>.fStore._4_4_,
                       Vpa.super_TPZVec<Fad<double>_>.fStore._0_4_) + 0x40),
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_990);
  pdVar1 = TPZFMatrix<double>::operator()(coord,0,1);
  local_990._8_8_ = *pdVar1;
  local_990._16_8_ = (double *)0x0;
  pFStack_978 = (Fad<double> *)
                CONCAT44(OUTv.super_TPZVec<Fad<double>_>.fStore._4_4_,
                         OUTv.super_TPZVec<Fad<double>_>.fStore._0_4_);
  Fad<double>::operator=
            ((Fad<double> *)
             CONCAT44(Vpb.super_TPZVec<Fad<double>_>.fStore._4_4_,
                      Vpb.super_TPZVec<Fad<double>_>.fStore._0_4_),
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_990);
  pdVar1 = TPZFMatrix<double>::operator()(coord,1,1);
  local_990._8_8_ = *pdVar1;
  local_990._16_8_ = (double *)0x0;
  pFStack_978 = (Fad<double> *)
                (CONCAT44(OUTv.super_TPZVec<Fad<double>_>.fStore._4_4_,
                          OUTv.super_TPZVec<Fad<double>_>.fStore._0_4_) + 0x20);
  Fad<double>::operator=
            ((Fad<double> *)
             (CONCAT44(Vpb.super_TPZVec<Fad<double>_>.fStore._4_4_,
                       Vpb.super_TPZVec<Fad<double>_>.fStore._0_4_) + 0x20),
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_990);
  pdVar1 = TPZFMatrix<double>::operator()(coord,2,1);
  local_990._8_8_ = *pdVar1;
  local_990._16_8_ = (double *)0x0;
  pFStack_978 = (Fad<double> *)
                (CONCAT44(OUTv.super_TPZVec<Fad<double>_>.fStore._4_4_,
                          OUTv.super_TPZVec<Fad<double>_>.fStore._0_4_) + 0x40);
  Fad<double>::operator=
            ((Fad<double> *)
             (CONCAT44(Vpb.super_TPZVec<Fad<double>_>.fStore._4_4_,
                       Vpb.super_TPZVec<Fad<double>_>.fStore._0_4_) + 0x40),
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_990);
  X<Fad<double>>(this,coord,par,&OUTv.super_TPZVec<Fad<double>_>);
  local_990._8_8_ = *(this->fCenter3D).super_TPZVec<double>.fStore;
  local_990._16_8_ = (double *)0x0;
  pFStack_978 = (Fad<double> *)
                CONCAT44(OUTv.super_TPZVec<Fad<double>_>.fStore._4_4_,
                         OUTv.super_TPZVec<Fad<double>_>.fStore._0_4_);
  Fad<double>::operator=
            (Vpc.super_TPZVec<Fad<double>_>.fStore,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_990);
  local_990._8_8_ = (this->fCenter3D).super_TPZVec<double>.fStore[1];
  local_990._16_8_ = (double *)0x0;
  pFStack_978 = (Fad<double> *)
                (CONCAT44(OUTv.super_TPZVec<Fad<double>_>.fStore._4_4_,
                          OUTv.super_TPZVec<Fad<double>_>.fStore._0_4_) + 0x20);
  Fad<double>::operator=
            (Vpc.super_TPZVec<Fad<double>_>.fStore + 1,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_990);
  local_990._8_8_ = (this->fCenter3D).super_TPZVec<double>.fStore[2];
  local_990._16_8_ = (double *)0x0;
  pFStack_978 = (Fad<double> *)
                (CONCAT44(OUTv.super_TPZVec<Fad<double>_>.fStore._4_4_,
                          OUTv.super_TPZVec<Fad<double>_>.fStore._0_4_) + 0x40);
  local_968 = this;
  Fad<double>::operator=
            (Vpc.super_TPZVec<Fad<double>_>.fStore + 2,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_990);
  local_900.fadexpr_.left_ =
       (Fad<double> *)
       CONCAT44(Vpa.super_TPZVec<Fad<double>_>.fStore._4_4_,
                Vpa.super_TPZVec<Fad<double>_>.fStore._0_4_);
  local_8c0._0_8_ = local_900.fadexpr_.left_ + 1;
  local_948 = (double)CONCAT44(Vpb.super_TPZVec<Fad<double>_>.fStore._4_4_,
                               Vpb.super_TPZVec<Fad<double>_>.fStore._0_4_);
  local_898 = &local_8c0;
  local_8c8 = Vpc.super_TPZVec<Fad<double>_>.fStore + 1;
  scale.val_ = (double)&local_898;
  local_8d8 = (Fad<double> *)((long)local_948 + 0x20);
  Vtnorm.val_ = (double)&scale;
  local_950 = local_900.fadexpr_.left_ + 2;
  local_8f0 = &local_950;
  local_960._8_8_ = Vpc.super_TPZVec<Fad<double>_>.fStore + 2;
  local_990._0_8_ = &Vtnorm;
  local_900.fadexpr_.right_ = (Fad<double> *)((long)local_948 + 0x40);
  local_990._8_8_ = local_960;
  local_960._0_8_ = &local_900;
  Vtnorm.dx_._0_8_ = &local_8f0;
  scale.dx_._0_8_ = &local_8d0;
  local_8e8 = (Fad<double> *)local_960._8_8_;
  local_8e0 = local_900.fadexpr_.left_;
  local_8d0 = &local_8e0;
  local_8c0.fadexpr_.left_.constant_ = local_948;
  local_890 = local_8c8;
  Fad<double>::operator=
            (gradx->fElem,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)local_990);
  local_8e0 = (Fad<double> *)
              CONCAT44(Vpa.super_TPZVec<Fad<double>_>.fStore._4_4_,
                       Vpa.super_TPZVec<Fad<double>_>.fStore._0_4_);
  local_900.fadexpr_.left_ = local_8e0 + 1;
  local_8c0.fadexpr_.left_.constant_ =
       (double)CONCAT44(Vpb.super_TPZVec<Fad<double>_>.fStore._4_4_,
                        Vpb.super_TPZVec<Fad<double>_>.fStore._0_4_);
  local_950 = local_8e0 + 2;
  local_948 = (double)((long)local_8c0.fadexpr_.left_.constant_ + 0x20);
  local_898 = &local_8c0;
  local_890 = Vpc.super_TPZVec<Fad<double>_>.fStore;
  local_8c8 = Vpc.super_TPZVec<Fad<double>_>.fStore;
  scale.val_ = (double)&local_898;
  local_960._8_8_ = Vpc.super_TPZVec<Fad<double>_>.fStore + 2;
  local_8f0 = &local_950;
  Vtnorm.val_ = (double)&scale;
  local_900.fadexpr_.right_ = (Fad<double> *)((long)local_8c0.fadexpr_.left_.constant_ + 0x40);
  local_990._0_8_ = &Vtnorm;
  local_990._8_8_ = local_960;
  local_960._0_8_ = &local_900;
  Vtnorm.dx_._0_8_ = &local_8f0;
  scale.dx_._0_8_ = &local_8d0;
  local_8e8 = (Fad<double> *)local_960._8_8_;
  local_8d8 = (Fad<double> *)local_948;
  local_8d0 = &local_8e0;
  local_8c0._0_8_ = local_878;
  local_878 = (undefined1  [8])local_900.fadexpr_.left_;
  Fad<double>::operator=
            (gradx->fElem + 1,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)local_990);
  local_8e0 = (Fad<double> *)
              CONCAT44(Vpa.super_TPZVec<Fad<double>_>.fStore._4_4_,
                       Vpa.super_TPZVec<Fad<double>_>.fStore._0_4_);
  scale.val_ = (double)&local_898;
  local_950 = local_8e0 + 2;
  local_8c0.fadexpr_.left_.constant_ =
       (double)CONCAT44(Vpb.super_TPZVec<Fad<double>_>.fStore._4_4_,
                        Vpb.super_TPZVec<Fad<double>_>.fStore._0_4_);
  local_900.fadexpr_.right_ = (Fad<double> *)((long)local_8c0.fadexpr_.left_.constant_ + 0x40);
  local_948 = (double)((long)local_8c0.fadexpr_.left_.constant_ + 0x20);
  local_8f0 = &local_950;
  Vtnorm.val_ = (double)&scale;
  local_900.fadexpr_.left_ = local_8e0 + 1;
  local_890 = Vpc.super_TPZVec<Fad<double>_>.fStore;
  local_8c8 = Vpc.super_TPZVec<Fad<double>_>.fStore;
  local_960._8_8_ = Vpc.super_TPZVec<Fad<double>_>.fStore + 1;
  local_990._0_8_ = &Vtnorm;
  local_990._8_8_ = local_960;
  local_960._0_8_ = &local_900;
  Vtnorm.dx_._0_8_ = &local_8f0;
  scale.dx_._0_8_ = &local_8d0;
  local_8e8 = (Fad<double> *)local_960._8_8_;
  local_8d8 = local_900.fadexpr_.right_;
  local_8d0 = &local_8e0;
  local_8c0._0_8_ = local_878;
  local_898 = &local_8c0;
  local_878 = (undefined1  [8])local_950;
  Fad<double>::operator=
            (gradx->fElem + 2,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)local_990);
  Vtnorm.val_ = 0.0;
  Vtnorm.dx_._0_8_ = Vtnorm.dx_._0_8_ & 0xffffffff00000000;
  Vtnorm.dx_.ptr_to_data = (double *)0x0;
  Vtnorm.defaultVal = 0.0;
  for (lVar2 = 0; lVar2 != 0x60; lVar2 = lVar2 + 0x20) {
    if (ABS(*(double *)
             (CONCAT44(Vt.super_TPZVec<Fad<double>_>.fStore._4_4_,
                       Vt.super_TPZVec<Fad<double>_>.fStore._0_4_) + lVar2)) < 1e-12) {
      local_990._0_8_ = (Fad<double> *)0x0;
      Fad<double>::operator=<double,_nullptr>
                ((Fad<double> *)
                 (CONCAT44(Vt.super_TPZVec<Fad<double>_>.fStore._4_4_,
                           Vt.super_TPZVec<Fad<double>_>.fStore._0_4_) + lVar2),(double *)local_990)
      ;
    }
    local_990._0_8_ = (long)&gradx->fElem->val_ + lVar2;
    local_990._8_8_ = local_990._0_8_;
    Fad<double>::operator+=(&Vtnorm,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_990);
  }
  if (Vtnorm.val_ < 0.0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/SpecialMaps/tpzarc3d.h"
               ,0xd2);
  }
  local_8a0 = local_968->fAngle;
  local_968 = (TPZArc3D *)local_968->fRadius;
  sqrt<double>((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_990,&Vtnorm);
  local_890 = (Fad<double> *)(local_8a0 * (double)local_968);
  local_8c0.fadexpr_.left_.constant_ = 2.0;
  local_8c0.fadexpr_.left_.defaultVal = 0.0;
  local_888 = 0.0;
  local_8c0.fadexpr_.right_ = (FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_990;
  local_880 = &local_8c0;
  Fad<double>::
  Fad<FadBinaryDiv<FadCst<double>,FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadFuncSqrt<Fad<double>>>>>>>
            (&scale,(FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>_>_>
                     *)&local_898);
  Fad<double>::~Fad((Fad<double> *)(local_990 + 8));
  for (lVar2 = 0; lVar2 != 0x60; lVar2 = lVar2 + 0x20) {
    local_990._0_8_ = (long)&gradx->fElem->val_ + lVar2;
    local_990._8_8_ = &scale;
    Fad<double>::operator=
              ((Fad<double> *)local_990._0_8_,
               (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_990);
  }
  Fad<double>::~Fad(&scale);
  Fad<double>::~Fad(&Vtnorm);
  TPZManVector<Fad<double>,_10>::~TPZManVector(&middle);
  TPZManVector<Fad<double>,_10>::~TPZManVector(&OUTv);
  TPZManVector<Fad<double>,_10>::~TPZManVector(&Vt);
  TPZManVector<Fad<double>,_10>::~TPZManVector(&Vpb);
  TPZManVector<Fad<double>,_10>::~TPZManVector(&Vpa);
  TPZManVector<Fad<double>,_10>::~TPZManVector(&Vpc);
  return;
}

Assistant:

void GradX(TPZFMatrix<REAL> &coord, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
        {
            
            /** Computing Axes */
            TPZManVector< T > Vpc(3,0.), Vpa(3,0.), Vpb(3,0.), Vt(3,0.), OUTv(3,0.);
            
            TPZManVector< T > middle(1, 0.);
            X(coord,middle,OUTv);
            
            /** Vector From MappedPoint to Ini */
            Vpa[0] = coord(0,0) - OUTv[0]; Vpa[1] = coord(1,0) - OUTv[1]; Vpa[2] = coord(2,0) - OUTv[2];
            
            /** Vector From MappedPoint to Fin */
            Vpb[0] = coord(0,1) - OUTv[0]; Vpb[1] = coord(1,1) - OUTv[1]; Vpb[2] = coord(2,1) - OUTv[2];
            
            X(coord,par,OUTv);
            
            /** Vector From MappedPoint to Center */
            Vpc[0] = fCenter3D[0] - OUTv[0]; Vpc[1] = fCenter3D[1] - OUTv[1]; Vpc[2] = fCenter3D[2] - OUTv[2];
            
            /** Tangent Vector From Point in the Arc */
            gradx(0) =  Vpa[1]*Vpb[0]*Vpc[1] - Vpa[0]*Vpb[1]*Vpc[1] + Vpa[2]*Vpb[0]*Vpc[2] - Vpa[0]*Vpb[2]*Vpc[2];
            gradx(1) = -Vpa[1]*Vpb[0]*Vpc[0] + Vpa[0]*Vpb[1]*Vpc[0] + Vpa[2]*Vpb[1]*Vpc[2] - Vpa[1]*Vpb[2]*Vpc[2];
            gradx(2) = -Vpa[2]*Vpb[0]*Vpc[0] + Vpa[0]*Vpb[2]*Vpc[0] - Vpa[2]*Vpb[1]*Vpc[1] + Vpa[1]*Vpb[2]*Vpc[1];
            
            T Vtnorm = 0.;
            for(int i = 0; i < 3; i++)
            {
                if( fabs(Vt[i]) < 1.E-12 ) Vt[i] = 0.;
                Vtnorm += gradx(i)*gradx(i);
            }
            if(Vtnorm < 0.) DebugStop();
//            if(sqrt(Vtnorm) < 1e-16) DebugStop();
            T scale = fAngle*fRadius/(2.*sqrt(Vtnorm));
            for(int j = 0; j < 3; j++) gradx(j) = gradx(j)*scale;

        }